

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR NpyArray::LoadArrayNPZ(FILE *fp,string *varname,NpyArray *arr)

{
  __type_conflict _Var1;
  size_t sVar2;
  void *__ptr;
  ulong uVar3;
  uint32_t size;
  uint32_t uncomprBytes;
  uint32_t comprBytes;
  uint16_t comprMethod;
  uint16_t lenExtraField;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined8 local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90;
  undefined4 local_88;
  allocator local_71;
  undefined1 local_70 [8];
  string vname;
  undefined1 local_48 [2];
  char local_46;
  char local_45;
  uint16_t lenName;
  char localHeader [32];
  NpyArray *arr_local;
  string *varname_local;
  FILE *fp_local;
  
  localHeader._24_8_ = arr;
  sVar2 = fread(local_48,1,0x1e,(FILE *)fp);
  if (sVar2 == 0x1e) {
    if ((local_46 == '\x03') && (local_45 == '\x04')) {
      vname.field_2._14_1_ = localHeader[0x12];
      vname.field_2._15_1_ = localHeader[0x13];
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_70,(ulong)(ushort)localHeader._18_2_,' ',&local_71);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      __ptr = (void *)std::__cxx11::string::operator[]((ulong)local_70);
      sVar2 = fread(__ptr,1,(ulong)(ushort)vname.field_2._14_2_,(FILE *)fp);
      if (sVar2 == (ushort)vname.field_2._14_2_) {
        local_a0._M_current = (char *)std::__cxx11::string::end();
        local_98 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_a0,4);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_90,&local_98);
        local_b0._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a8,&local_b0);
        std::__cxx11::string::erase(local_70,local_90,local_a8);
        fseek((FILE *)fp,(ulong)(ushort)localHeader._20_2_,1);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) != 0) ||
           (_Var1 = std::operator==(varname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70), _Var1)) {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) {
            std::__cxx11::string::operator=((string *)varname,(string *)local_70);
          }
          if (localHeader._0_2_ == 0) {
            fp_local = (FILE *)LoadNPY((NpyArray *)localHeader._24_8_,fp);
          }
          else {
            fp_local = (FILE *)LoadNPZ((NpyArray *)localHeader._24_8_,fp,localHeader._10_4_,
                                       localHeader._14_4_);
          }
        }
        else {
          fseek((FILE *)fp,(ulong)(uint)localHeader._14_4_,1);
          fp_local = (FILE *)0x0;
        }
      }
      else {
        fp_local = (FILE *)anon_var_dwarf_148;
      }
      local_88 = 1;
      std::__cxx11::string::~string((string *)local_70);
    }
    else {
      fp_local = (FILE *)0x1;
    }
  }
  else {
    fp_local = (FILE *)anon_var_dwarf_148;
  }
  return (LPCSTR)fp_local;
}

Assistant:

LPCSTR NpyArray::LoadArrayNPZ(FILE* fp, std::string& varname, NpyArray& arr)
{
	char localHeader[32];
	if (fread(localHeader, sizeof(char), 30, fp) != 30)
		return "error: failed fread";

	// if we've reached the global header, stop reading
	if (localHeader[2] != 0x03 || localHeader[3] != 0x04)
		return (const char*)1;

	// read in the variable name
	const uint16_t lenName = *reinterpret_cast<uint16_t*>(localHeader+26);
	std::string vname(lenName, ' ');
	if (fread(&vname[0], sizeof(char), lenName, fp) != lenName)
		return "error: failed fread";

	// erase the lagging .npy        
	vname.erase(vname.end()-4, vname.end());

	// read in the extra field
	const uint16_t lenExtraField = *reinterpret_cast<uint16_t*>(localHeader+28);
	fseek(fp, lenExtraField, SEEK_CUR); // skip past the extra field

	if (varname.empty() || varname == vname) {
		// read current array
		if (varname.empty())
			varname = vname;
		const uint16_t comprMethod = *reinterpret_cast<uint16_t*>(localHeader+8);
		if (comprMethod == 0)
			return arr.LoadNPY(fp);
		const uint32_t comprBytes = *reinterpret_cast<uint32_t*>(localHeader+18);
		const uint32_t uncomprBytes = *reinterpret_cast<uint32_t*>(localHeader+22);
		return arr.LoadNPZ(fp, comprBytes, uncomprBytes);
	}

	// skip current array data
	const uint32_t size = *reinterpret_cast<uint32_t*>(localHeader+22);
	fseek(fp, size, SEEK_CUR);
	return NULL;
}